

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

void __thiscall Fl_Group::draw_child(Fl_Group *this,Fl_Widget *widget)

{
  int iVar1;
  
  if ((((widget->flags_ & 2) == 0) && (widget->type_ < 0xf0)) &&
     (iVar1 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2c])
                        (fl_graphics_driver,(ulong)(uint)widget->x_,(ulong)(uint)widget->y_,
                         (ulong)(uint)widget->w_,(ulong)(uint)widget->h_), iVar1 != 0)) {
    widget->damage_ = 0x80;
    (*widget->_vptr_Fl_Widget[2])(widget);
    widget->damage_ = '\0';
  }
  return;
}

Assistant:

void Fl_Group::draw_child(Fl_Widget& widget) const {
  if (widget.visible() && widget.type() < FL_WINDOW &&
      fl_not_clipped(widget.x(), widget.y(), widget.w(), widget.h())) {
    widget.clear_damage(FL_DAMAGE_ALL);
    widget.draw();
    widget.clear_damage();
  }
}